

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseName(xmlParserCtxtPtr ctxt)

{
  int len;
  xmlChar *pxVar1;
  bool bVar2;
  int count;
  xmlChar *ret;
  xmlChar *in;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  ret = ctxt->input->cur;
  if ((((0x60 < *ret) && (*ret < 0x7b)) || ((0x40 < *ret && (*ret < 0x5b)))) ||
     ((*ret == 0x5f || (*ret == 0x3a)))) {
    do {
      ret = ret + 1;
      if (((*ret < 0x61) || (bVar2 = true, 0x7a < *ret)) &&
         ((((*ret < 0x41 || (bVar2 = true, 0x5a < *ret)) &&
           ((*ret < 0x30 || (bVar2 = true, 0x39 < *ret)))) &&
          (((bVar2 = true, *ret != '_' && (bVar2 = true, *ret != '-')) &&
           (bVar2 = true, *ret != ':')))))) {
        bVar2 = *ret == '.';
      }
    } while (bVar2);
    if ((*ret != '\0') && (*ret < 0x80)) {
      len = (int)ret - (int)ctxt->input->cur;
      if ((50000 < len) && ((ctxt->options & 0x80000U) == 0)) {
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"Name");
        return (xmlChar *)0x0;
      }
      pxVar1 = xmlDictLookup(ctxt->dict,ctxt->input->cur,len);
      ctxt->input->cur = ret;
      ctxt->input->col = len + ctxt->input->col;
      if (pxVar1 != (xmlChar *)0x0) {
        return pxVar1;
      }
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlChar *)0x0;
    }
  }
  pxVar1 = xmlParseNameComplex(ctxt);
  return pxVar1;
}

Assistant:

const xmlChar *
xmlParseName(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    const xmlChar *ret;
    int count = 0;

    GROW;

#ifdef DEBUG
    nbParseName++;
#endif

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    if (((*in >= 0x61) && (*in <= 0x7A)) ||
	((*in >= 0x41) && (*in <= 0x5A)) ||
	(*in == '_') || (*in == ':')) {
	in++;
	while (((*in >= 0x61) && (*in <= 0x7A)) ||
	       ((*in >= 0x41) && (*in <= 0x5A)) ||
	       ((*in >= 0x30) && (*in <= 0x39)) ||
	       (*in == '_') || (*in == '-') ||
	       (*in == ':') || (*in == '.'))
	    in++;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
            if ((count > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Name");
                return(NULL);
            }
	    ret = xmlDictLookup(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    if (ret == NULL)
	        xmlErrMemory(ctxt, NULL);
	    return(ret);
	}
    }
    /* accelerator for special cases */
    return(xmlParseNameComplex(ctxt));
}